

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropulsionSystemData.h
# Opt level: O0

void __thiscall
DIS::PropulsionSystemData::PropulsionSystemData
          (PropulsionSystemData *this,PropulsionSystemData *param_1)

{
  float fVar1;
  PropulsionSystemData *param_1_local;
  PropulsionSystemData *this_local;
  
  this->_vptr_PropulsionSystemData = (_func_int **)&PTR__PropulsionSystemData_002688d8;
  fVar1 = param_1->_engineRpm;
  this->_powerSetting = param_1->_powerSetting;
  this->_engineRpm = fVar1;
  return;
}

Assistant:

class OPENDIS7_EXPORT PropulsionSystemData
{
protected:
  /** powerSetting */
  float _powerSetting; 

  /** engine RPMs */
  float _engineRpm; 


 public:
    PropulsionSystemData();
    virtual ~PropulsionSystemData();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getPowerSetting() const; 
    void setPowerSetting(float pX); 

    float getEngineRpm() const; 
    void setEngineRpm(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const PropulsionSystemData& rhs) const;
}